

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAnalytic_mels.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  double t_00;
  long nreLS;
  long ncfn;
  long netf;
  long nni;
  long nre;
  long nst;
  sunrealtype tout;
  sunrealtype t;
  void *ida_mem;
  SUNLinearSolver LS;
  N_Vector yp;
  N_Vector yy;
  int retval;
  sunrealtype alpha;
  sunrealtype abstol;
  sunrealtype reltol;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  SUNContext ctx;
  double in_stack_ffffffffffffff48;
  SUNContext in_stack_ffffffffffffff50;
  N_Vector in_stack_ffffffffffffff58;
  sunrealtype in_stack_ffffffffffffff60;
  undefined8 local_98;
  sunrealtype in_stack_ffffffffffffff70;
  sunrealtype in_stack_ffffffffffffff78;
  N_Vector y;
  undefined8 local_70;
  SUNLinearSolver local_68;
  undefined8 local_60;
  long *local_58;
  int local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  double local_28;
  double local_20;
  N_Vector local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_18 = (N_Vector)0x0;
  local_20 = 1.0;
  local_28 = 0.1;
  local_30 = 2;
  local_38 = 0x3f1a36e2eb1c432d;
  local_40 = 0x3e112e0be826d695;
  local_48 = 0x4024000000000000;
  local_58 = (long *)0x0;
  local_60 = 0;
  local_68 = (SUNLinearSolver)0x0;
  local_70 = 0;
  printf("\nAnalytical DAE test problem:\n");
  printf("    alpha = %g\n",local_48);
  printf("   reltol = %.1e\n",local_38);
  printf("   abstol = %.1e\n\n",local_40);
  local_4c = SUNContext_Create(0,&local_10);
  iVar2 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2);
  if (iVar1 == 0) {
    local_58 = (long *)N_VNew_Serial(local_30,local_10);
    iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2);
    if (iVar1 == 0) {
      local_60 = N_VClone(local_58);
      iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2);
      if (iVar1 == 0) {
        analytical_solution(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            (N_Vector)in_stack_ffffffffffffff50);
        local_70 = IDACreate(local_10);
        iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2);
        if (iVar1 == 0) {
          local_4c = IDAInit(local_18,local_70,fres,local_58,local_60);
          iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2);
          if (iVar1 == 0) {
            local_4c = IDASetUserData(local_70,&local_48);
            iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2);
            if (iVar1 == 0) {
              local_4c = IDASStolerances(local_38,local_40,local_70);
              iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar2
                                  );
              if (iVar1 == 0) {
                local_68 = MatrixEmbeddedLS(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
                iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                                     iVar2);
                if (iVar1 == 0) {
                  local_4c = IDASetLinearSolver(local_70,local_68,0);
                  iVar1 = check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                                       iVar2);
                  if (iVar1 == 0) {
                    t_00 = (double)local_18 + local_28;
                    y = local_18;
                    printf("        t          x1         x2\n");
                    printf("   ----------------------------------\n");
                    while (iVar1 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                          1e-15 < local_20 - (double)y) {
                      local_4c = IDASolve(t_00,local_70,&stack0xffffffffffffff88,local_58,local_60,1
                                         );
                      iVar2 = check_retval(in_stack_ffffffffffffff58,
                                           (char *)in_stack_ffffffffffffff50,iVar1);
                      if (iVar2 != 0) {
                        return 1;
                      }
                      printf("  %10.6f  %10.6f  %10.6f\n",y,**(undefined8 **)(*local_58 + 0x10),
                             *(undefined8 *)(*(long *)(*local_58 + 0x10) + 8));
                      if (local_4c < 0) {
                        fprintf(_stderr,"Solver failure, stopping integration\n");
                        break;
                      }
                      in_stack_ffffffffffffff48 = local_28 + t_00;
                      t_00 = in_stack_ffffffffffffff48;
                      if (local_20 < in_stack_ffffffffffffff48) {
                        in_stack_ffffffffffffff48 = local_20;
                        t_00 = local_20;
                      }
                    }
                    printf("   ----------------------------------\n");
                    local_4c = IDAGetNumSteps(local_70,&stack0xffffffffffffff78);
                    check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar1);
                    local_4c = IDAGetNumResEvals(local_70,&stack0xffffffffffffff70);
                    check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar1);
                    local_4c = IDAGetNumNonlinSolvIters(local_70,&local_98);
                    check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar1);
                    local_4c = IDAGetNumErrTestFails(local_70,&stack0xffffffffffffff60);
                    check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar1);
                    local_4c = IDAGetNumNonlinSolvConvFails(local_70,&stack0xffffffffffffff58);
                    check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar1);
                    local_4c = IDAGetNumLinResEvals(local_70,&stack0xffffffffffffff50);
                    check_retval(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,iVar1);
                    printf("\nFinal Solver Statistics: \n\n");
                    printf("Number of steps                    = %ld\n",in_stack_ffffffffffffff78);
                    printf("Number of residual evaluations     = %ld\n",
                           (long)&in_stack_ffffffffffffff50->profiler +
                           (long)in_stack_ffffffffffffff70);
                    printf("Number of nonlinear iterations     = %ld\n",local_98);
                    printf("Number of error test failures      = %ld\n",in_stack_ffffffffffffff60);
                    printf("Number of nonlinear conv. failures = %ld\n",in_stack_ffffffffffffff58);
                    local_4c = check_ans(y,t_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
                    ;
                    IDAFree(&local_70);
                    SUNLinSolFree(local_68);
                    N_VDestroy(local_58);
                    N_VDestroy(local_60);
                    SUNContext_Free(&local_10);
                    local_4 = local_4c;
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* SUNDIALS context object */
  SUNContext ctx;

  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype dTout  = SUN_RCONST(0.1);    /* time between outputs */
  sunindextype NEQ   = 2;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-4); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-9);
  sunrealtype alpha  = SUN_RCONST(10.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector yy        = NULL; /* empty vector for storing solution */
  N_Vector yp        = NULL; /* empty vector for storing solution derivative */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* ida_mem      = NULL; /* empty IDA memory structure */
  sunrealtype t, tout;
  long int nst, nre, nni, netf, ncfn, nreLS;

  /* Initial diagnostics output */
  printf("\nAnalytical DAE test problem:\n");
  printf("    alpha = %" GSYM "\n", alpha);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initialize data structures */
  yy = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return 1; }
  yp = N_VClone(yy); /* Create serial vector for solution derivative */
  if (check_retval((void*)yp, "N_VClone", 0)) { return 1; }
  analytical_solution(T0, yy, yp); /* Specify initial conditions */

  /* Call IDACreate and IDAInit to initialize IDA memory */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(ida_mem, fres, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set routines */
  retval = IDASetUserData(ida_mem, (void*)&alpha);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }
  retval = IDASStolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(ida_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Attach the linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, NULL);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t          x1         x2\n");
  printf("   ----------------------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = IDASolve(ida_mem, tout, &t, yy, yp, IDA_NORMAL); /* call integrator */
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(yy, 0), NV_Ith_S(yy, 1)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ----------------------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = IDAGetNumSteps(ida_mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetNumResEvals(ida_mem, &nre);
  check_retval(&retval, "IDAGetNumResEvals", 1);
  retval = IDAGetNumNonlinSolvIters(ida_mem, &nni);
  check_retval(&retval, "IDAGetNumNonlinSolvIters", 1);
  retval = IDAGetNumErrTestFails(ida_mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(ida_mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  retval = IDAGetNumLinResEvals(ida_mem, &nreLS);
  check_retval(&retval, "IDAGetNumLinResEvals", 1);

  printf("\nFinal Solver Statistics: \n\n");
  printf("Number of steps                    = %ld\n", nst);
  printf("Number of residual evaluations     = %ld\n", nre + nreLS);
  printf("Number of nonlinear iterations     = %ld\n", nni);
  printf("Number of error test failures      = %ld\n", netf);
  printf("Number of nonlinear conv. failures = %ld\n", ncfn);

  /* check the solution error */
  retval = check_ans(yy, t, reltol, abstol);

  /* Clean up and return */
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}